

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O0

void __thiscall
DebugUtilsData::WrapCallbackData
          (DebugUtilsData *this,AugmentedCallbackData *aug_data,
          XrDebugUtilsMessengerCallbackDataEXT *callback_data)

{
  bool bVar1;
  XrSdkLogObjectInfo *pXVar2;
  XrSession_T **ppXVar3;
  reference info;
  XrDebugUtilsObjectNameInfoEXT *pXVar4;
  size_type sVar5;
  XrDebugUtilsLabelEXT *local_68;
  XrDebugUtilsObjectNameInfoEXT *obj_1;
  iterator __end1;
  iterator __begin1;
  vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_> *__range1;
  XrSession session;
  XrDebugUtilsObjectNameInfoEXT *current_obj;
  uint32_t obj;
  bool name_found;
  XrDebugUtilsMessengerCallbackDataEXT *callback_data_local;
  AugmentedCallbackData *aug_data_local;
  DebugUtilsData *this_local;
  
  aug_data->exported_data = callback_data;
  bVar1 = ObjectInfoCollection::Empty(&this->object_info_);
  if ((!bVar1) && (callback_data->objectCount != 0)) {
    bVar1 = false;
    for (current_obj._0_4_ = 0; (uint)current_obj < callback_data->objectCount;
        current_obj._0_4_ = (uint)current_obj + 1) {
      pXVar4 = callback_data->objects;
      pXVar2 = ObjectInfoCollection::LookUpStoredObjectInfo
                         (&this->object_info_,pXVar4[(uint)current_obj].objectHandle,
                          pXVar4[(uint)current_obj].objectType);
      bVar1 = bVar1 || pXVar2 != (XrSdkLogObjectInfo *)0x0;
      if (pXVar4[(uint)current_obj].objectType == XR_OBJECT_TYPE_SESSION) {
        ppXVar3 = TreatIntegerAsHandle<XrSession_T*>(&pXVar4[(uint)current_obj].objectHandle);
        LookUpSessionLabels(this,*ppXVar3,&aug_data->labels);
      }
    }
    if ((bVar1) ||
       (bVar1 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::empty
                          (&aug_data->labels), !bVar1)) {
      memcpy(&aug_data->modified_data,callback_data,0x48);
      std::vector<XrDebugUtilsObjectNameInfoEXT,std::allocator<XrDebugUtilsObjectNameInfoEXT>>::
      assign<XrDebugUtilsObjectNameInfoEXT*,void>
                ((vector<XrDebugUtilsObjectNameInfoEXT,std::allocator<XrDebugUtilsObjectNameInfoEXT>>
                  *)&aug_data->new_objects,callback_data->objects,
                 callback_data->objects + callback_data->objectCount);
      __end1 = std::
               vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
               ::begin(&aug_data->new_objects);
      obj_1 = (XrDebugUtilsObjectNameInfoEXT *)
              std::
              vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
              ::end(&aug_data->new_objects);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<XrDebugUtilsObjectNameInfoEXT_*,_std::vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>_>
                                         *)&obj_1), bVar1) {
        info = __gnu_cxx::
               __normal_iterator<XrDebugUtilsObjectNameInfoEXT_*,_std::vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>_>
               ::operator*(&__end1);
        ObjectInfoCollection::LookUpObjectName(&this->object_info_,info);
        __gnu_cxx::
        __normal_iterator<XrDebugUtilsObjectNameInfoEXT_*,_std::vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>_>
        ::operator++(&__end1);
      }
      pXVar4 = std::
               vector<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
               ::data(&aug_data->new_objects);
      (aug_data->modified_data).objects = pXVar4;
      sVar5 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::size
                        (&aug_data->labels);
      (aug_data->modified_data).sessionLabelCount = (uint32_t)sVar5;
      bVar1 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::empty
                        (&aug_data->labels);
      if (bVar1) {
        local_68 = (XrDebugUtilsLabelEXT *)0x0;
      }
      else {
        local_68 = std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::data
                             (&aug_data->labels);
      }
      (aug_data->modified_data).sessionLabels = local_68;
      aug_data->exported_data = &aug_data->modified_data;
    }
  }
  return;
}

Assistant:

void DebugUtilsData::WrapCallbackData(AugmentedCallbackData* aug_data,
                                      const XrDebugUtilsMessengerCallbackDataEXT* callback_data) const {
    // If there's nothing to add, just return the original data as the augmented copy
    aug_data->exported_data = callback_data;
    if (object_info_.Empty() || callback_data->objectCount == 0) {
        return;
    }

    // Inspect each of the callback objects
    bool name_found = false;
    for (uint32_t obj = 0; obj < callback_data->objectCount; ++obj) {
        auto& current_obj = callback_data->objects[obj];
        name_found |= (nullptr != object_info_.LookUpStoredObjectInfo(current_obj.objectHandle, current_obj.objectType));

        // If this is a session, record any labels associated with it
        if (XR_OBJECT_TYPE_SESSION == current_obj.objectType) {
            XrSession session = TreatIntegerAsHandle<XrSession>(current_obj.objectHandle);
            LookUpSessionLabels(session, aug_data->labels);
        }
    }

    // If we found nothing to add, return the original data
    if (!name_found && aug_data->labels.empty()) {
        return;
    }

    // Found additional data - modify an internal copy and return that as the exported data
    memcpy(&aug_data->modified_data, callback_data, sizeof(XrDebugUtilsMessengerCallbackDataEXT));
    aug_data->new_objects.assign(callback_data->objects, callback_data->objects + callback_data->objectCount);

    // Record (overwrite) the names of all incoming objects provided in our internal list
    for (auto& obj : aug_data->new_objects) {
        object_info_.LookUpObjectName(obj);
    }

    // Update local copy & point export to it
    aug_data->modified_data.objects = aug_data->new_objects.data();
    aug_data->modified_data.sessionLabelCount = static_cast<uint32_t>(aug_data->labels.size());
    aug_data->modified_data.sessionLabels = aug_data->labels.empty() ? nullptr : aug_data->labels.data();
    aug_data->exported_data = &aug_data->modified_data;
    return;
}